

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O0

void __thiscall
test_fixture::add_test(test_fixture *this,offset_in_test_fixture_to_subr test,string *name)

{
  string *in_RCX;
  undefined1 local_98 [8];
  test_host tc;
  string *name_local;
  offset_in_test_fixture_to_subr test_local;
  test_fixture *this_local;
  
  test_host::test_host((test_host *)local_98);
  tc.fixture = (test_fixture *)test;
  tc.test = (offset_in_test_fixture_to_subr)name;
  std::__cxx11::string::operator=((string *)&tc.field_0x10,in_RCX);
  local_98 = (undefined1  [8])this;
  std::vector<test_host,_std::allocator<test_host>_>::push_back
            (&this->_tests,(value_type *)local_98);
  test_host::~test_host((test_host *)local_98);
  return;
}

Assistant:

void add_test( void (test_fixture::*test)(), std::string name )
    {
        struct test_host tc;
        tc.test = test;
        tc.test_name = name;
        tc.fixture = this;
        _tests.push_back( tc );
    }